

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllContentModel.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::AllContentModel::buildChildList
          (AllContentModel *this,ContentSpecNode *curNode,
          ValueVectorOf<xercesc_4_0::QName_*> *toFill,ValueVectorOf<bool> *toOptional)

{
  ContentSpecNode **ppCVar1;
  QName *pQVar2;
  XMLSize_t XVar3;
  RuntimeException *this_00;
  int iVar4;
  int iVar5;
  
LAB_002e3ece:
  switch(curNode->fType) {
  case Leaf:
    pQVar2 = curNode->fElement;
    ValueVectorOf<xercesc_4_0::QName_*>::ensureExtraCapacity(toFill,1);
    XVar3 = toFill->fCurCount;
    toFill->fCurCount = XVar3 + 1;
    toFill->fElemList[XVar3] = pQVar2;
    ValueVectorOf<bool>::ensureExtraCapacity(toOptional,1);
    XVar3 = toOptional->fCurCount;
    toOptional->fCurCount = XVar3 + 1;
    toOptional->fElemList[XVar3] = false;
    this->fNumRequired = this->fNumRequired + 1;
    return;
  case ZeroOrOne:
    if (curNode->fFirst->fType == Leaf) {
      pQVar2 = curNode->fFirst->fElement;
      ValueVectorOf<xercesc_4_0::QName_*>::ensureExtraCapacity(toFill,1);
      XVar3 = toFill->fCurCount;
      toFill->fCurCount = XVar3 + 1;
      toFill->fElemList[XVar3] = pQVar2;
      ValueVectorOf<bool>::ensureExtraCapacity(toOptional,1);
      XVar3 = toOptional->fCurCount;
      toOptional->fCurCount = XVar3 + 1;
      toOptional->fElemList[XVar3] = true;
      return;
    }
    this_00 = (RuntimeException *)__cxa_allocate_exception(0x30);
    RuntimeException::RuntimeException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/common/AllContentModel.cpp"
               ,0x158,CM_UnknownCMSpecType,this->fMemoryManager);
    goto LAB_002e40cb;
  case ZeroOrMore:
    curNode = curNode->fFirst;
    if ((curNode != (ContentSpecNode *)0x0) && (curNode->fType == Loop)) goto LAB_002e3ece;
    break;
  case All:
    goto switchD_002e3ee4_caseD_9;
  case Loop:
    iVar5 = curNode->fMinOccurs;
    if (0 < iVar5) {
      iVar4 = 0;
      do {
        pQVar2 = curNode->fElement;
        ValueVectorOf<xercesc_4_0::QName_*>::ensureExtraCapacity(toFill,1);
        XVar3 = toFill->fCurCount;
        toFill->fCurCount = XVar3 + 1;
        toFill->fElemList[XVar3] = pQVar2;
        ValueVectorOf<bool>::ensureExtraCapacity(toOptional,1);
        XVar3 = toOptional->fCurCount;
        toOptional->fCurCount = XVar3 + 1;
        toOptional->fElemList[XVar3] = false;
        this->fNumRequired = this->fNumRequired + 1;
        iVar4 = iVar4 + 1;
        iVar5 = curNode->fMinOccurs;
      } while (iVar4 < iVar5);
    }
    if (iVar5 < curNode->fMaxOccurs && curNode->fMaxOccurs != -1) {
      iVar5 = 0;
      do {
        pQVar2 = curNode->fElement;
        ValueVectorOf<xercesc_4_0::QName_*>::ensureExtraCapacity(toFill,1);
        XVar3 = toFill->fCurCount;
        toFill->fCurCount = XVar3 + 1;
        toFill->fElemList[XVar3] = pQVar2;
        ValueVectorOf<bool>::ensureExtraCapacity(toOptional,1);
        XVar3 = toOptional->fCurCount;
        toOptional->fCurCount = XVar3 + 1;
        toOptional->fElemList[XVar3] = true;
        iVar5 = iVar5 + 1;
      } while (iVar5 < curNode->fMaxOccurs - curNode->fMinOccurs);
    }
    return;
  }
  this_00 = (RuntimeException *)__cxa_allocate_exception(0x30);
  RuntimeException::RuntimeException
            (this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/common/AllContentModel.cpp"
             ,0x177,CM_UnknownCMSpecType,this->fMemoryManager);
LAB_002e40cb:
  __cxa_throw(this_00,&RuntimeException::typeinfo,XMLException::~XMLException);
switchD_002e3ee4_caseD_9:
  ppCVar1 = &curNode->fFirst;
  curNode = curNode->fSecond;
  buildChildList(this,*ppCVar1,toFill,toOptional);
  if (curNode == (ContentSpecNode *)0x0) {
    return;
  }
  goto LAB_002e3ece;
}

Assistant:

void
AllContentModel::buildChildList(ContentSpecNode* const       curNode
                              , ValueVectorOf<QName*>&       toFill
                              , ValueVectorOf<bool>&         toOptional)
{
    // Get the type of spec node our current node is
    const ContentSpecNode::NodeTypes curType = curNode->getType();

    if (curType == ContentSpecNode::All)
    {
        // Get both the child node pointers
        ContentSpecNode* leftNode = curNode->getFirst();
        ContentSpecNode* rightNode = curNode->getSecond();

        // Recurse on the left and right nodes
        buildChildList(leftNode, toFill, toOptional);
        if(rightNode)
            buildChildList(rightNode, toFill, toOptional);
    }
    else if (curType == ContentSpecNode::Leaf)
    {
        // At leaf, add the element to list of elements permitted in the all
        toFill.addElement(curNode->getElement());
        toOptional.addElement(false);
        fNumRequired++;
    }
    else if (curType == ContentSpecNode::ZeroOrOne)
    {
        // At ZERO_OR_ONE node, subtree must be an element
        // that was specified with minOccurs=0, maxOccurs=1
        ContentSpecNode* leftNode = curNode->getFirst();
        if (leftNode->getType() != ContentSpecNode::Leaf)
            ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::CM_UnknownCMSpecType, fMemoryManager);

        toFill.addElement(leftNode->getElement());
        toOptional.addElement(true);
    }
    // only allow ZeroOrMore when it's the father of a Loop
    else if (curType == ContentSpecNode::ZeroOrMore &&
             curNode->getFirst()!=0 &&
             curNode->getFirst()->getType()==ContentSpecNode::Loop)
    {
        ContentSpecNode* leftNode = curNode->getFirst();
        buildChildList(leftNode, toFill, toOptional);
    }
    else if (curType == ContentSpecNode::Loop)
    {
        // At leaf, add the element to list of elements permitted in the all
        int i;
        for(i=0;i<curNode->getMinOccurs();i++)
        {
            toFill.addElement(curNode->getElement());
            toOptional.addElement(false);
            fNumRequired++;
        }
        if(curNode->getMaxOccurs()!=-1)
            for(i=0;i<(curNode->getMaxOccurs() - curNode->getMinOccurs());i++)
            {
                toFill.addElement(curNode->getElement());
                toOptional.addElement(true);
            }
    }
    else
        ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::CM_UnknownCMSpecType, fMemoryManager);
}